

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sphere.h
# Opt level: O0

bool __thiscall cert::Sphere::intersects(Sphere *this,Ray *r,float t_min,float t_max)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  double dVar5;
  Vec3 VVar6;
  float positive;
  float negative;
  float discriminant;
  float c;
  float b;
  float a;
  float local_40;
  undefined1 local_34 [8];
  Vec3 oc;
  float t_max_local;
  float t_min_local;
  Ray *r_local;
  Sphere *this_local;
  
  oc.y = t_max;
  oc.z = t_min;
  VVar6 = operator-(&r->origin,&this->center);
  _b = VVar6._0_8_;
  local_34._0_4_ = b;
  local_34._4_4_ = a;
  local_40 = VVar6.z;
  oc.x = local_40;
  fVar1 = dot(&r->direction,&r->direction);
  fVar2 = dot((Vec3 *)local_34,&r->direction);
  fVar3 = dot((Vec3 *)local_34,(Vec3 *)local_34);
  fVar3 = fVar2 * fVar2 + -(fVar1 * (-this->radius * this->radius + fVar3));
  if (0.0 < fVar3) {
    dVar5 = sqrt((double)(ulong)(uint)fVar3);
    fVar4 = (-fVar2 - SUB84(dVar5,0)) / fVar1;
    if ((oc.y <= fVar4) || (fVar4 <= oc.z)) {
      dVar5 = sqrt((double)(ulong)(uint)fVar3);
      fVar1 = (-fVar2 + SUB84(dVar5,0)) / fVar1;
      if ((oc.y <= fVar1) || (fVar1 <= oc.z)) {
        this_local._7_1_ = false;
      }
      else {
        this_local._7_1_ = true;
      }
    }
    else {
      this_local._7_1_ = true;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

constexpr virtual bool intersects (const Ray& r, float t_min, float t_max) const
	{
		Vec3 oc = r.origin - center;
		float a = dot (r.direction, r.direction);
		float b = dot (oc, r.direction);
		float c = dot (oc, oc) - radius * radius;
		float discriminant = b * b - a * c;
		if (discriminant <= 0) return false;
		float negative = (-b - sqrt (discriminant)) / a;
		if (negative < t_max && negative > t_min)
		{
			return true;
		}
		float positive = (-b + sqrt (discriminant)) / a;
		if (positive < t_max && positive > t_min)
		{
			return true;
		}
		return false;
	}